

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_check_group_id(SSL_HANDSHAKE *hs,uint16_t group_id)

{
  uint16_t uVar1;
  size_t sVar2;
  unsigned_short *puVar3;
  int iVar4;
  undefined6 in_register_00000032;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  iVar4 = (int)CONCAT62(in_register_00000032,group_id);
  if (iVar4 == 0) {
    return false;
  }
  if (((iVar4 == 0x6399) || (iVar4 == 0x11ec)) &&
     (uVar1 = ssl_protocol_version(hs->ssl), uVar1 < 0x304)) {
    return false;
  }
  sVar2 = (hs->config->supported_group_list).size_;
  if (sVar2 == 0) {
    puVar3 = &kDefaultGroups;
    sVar2 = 3;
  }
  else {
    puVar3 = (hs->config->supported_group_list).data_;
  }
  lVar5 = 0;
  do {
    bVar6 = *(uint16_t *)((long)puVar3 + lVar5) == group_id;
    if (bVar6) {
      return bVar6;
    }
    bVar7 = sVar2 * 2 + -2 != lVar5;
    lVar5 = lVar5 + 2;
  } while (bVar7);
  return bVar6;
}

Assistant:

bool tls1_check_group_id(const SSL_HANDSHAKE *hs, uint16_t group_id) {
  if (is_post_quantum_group(group_id) &&
      ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    // Post-quantum "groups" require TLS 1.3.
    return false;
  }

  // We internally assume zero is never allocated as a group ID.
  if (group_id == 0) {
    return false;
  }

  for (uint16_t supported : tls1_get_grouplist(hs)) {
    if (supported == group_id) {
      return true;
    }
  }

  return false;
}